

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfect_hash_join_executor.cpp
# Opt level: O2

void __thiscall
duckdb::PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe<long>
          (PerfectHashJoinExecutor *this,Vector *source,SelectionVector *build_sel_vec,
          SelectionVector *probe_sel_vec,idx_t count,idx_t *probe_sel_count)

{
  _Head_base<0UL,_bool_*,_false> _Var1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  int64_t iVar5;
  int64_t iVar6;
  idx_t iVar7;
  idx_t idx;
  ulong uVar8;
  idx_t i;
  ulong uVar9;
  idx_t iVar10;
  idx_t idx_1;
  long lVar11;
  idx_t iVar12;
  UnifiedVectorFormat vector_data;
  UnifiedVectorFormat local_78;
  
  iVar5 = Value::GetValueUnsafe<long>(&(this->perfect_join_statistics).build_min);
  iVar6 = Value::GetValueUnsafe<long>(&(this->perfect_join_statistics).build_max);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_78);
  Vector::ToUnifiedFormat(source,count,&local_78);
  iVar7 = *probe_sel_count;
  _Var1._M_head_impl =
       (this->bitmap_build_idx).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
       super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
       super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.
       super__Head_base<0UL,_bool_*,_false>._M_head_impl;
  psVar2 = build_sel_vec->sel_vector;
  psVar3 = probe_sel_vec->sel_vector;
  if (local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
      (unsigned_long *)0x0) {
    lVar11 = 0;
    for (iVar10 = 0; count != iVar10; iVar10 = iVar10 + 1) {
      iVar12 = iVar10;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        iVar12 = (idx_t)(local_78.sel)->sel_vector[iVar10];
      }
      lVar4 = *(long *)(local_78.data + iVar12 * 8);
      if ((lVar4 <= iVar6 && iVar5 <= lVar4) && (_Var1._M_head_impl[lVar4 - iVar5] == true)) {
        psVar2[lVar11] = (sel_t)(lVar4 - iVar5);
        psVar3[lVar11] = (sel_t)iVar10;
        lVar11 = lVar11 + 1;
        iVar7 = iVar7 + 1;
        *probe_sel_count = iVar7;
      }
    }
  }
  else {
    lVar11 = 0;
    for (uVar9 = 0; count != uVar9; uVar9 = uVar9 + 1) {
      uVar8 = uVar9;
      if ((local_78.sel)->sel_vector != (sel_t *)0x0) {
        uVar8 = (ulong)(local_78.sel)->sel_vector[uVar9];
      }
      if ((local_78.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar8 >> 6] >>
           (uVar8 & 0x3f) & 1) != 0) {
        lVar4 = *(long *)(local_78.data + uVar8 * 8);
        if ((lVar4 <= iVar6 && iVar5 <= lVar4) && (_Var1._M_head_impl[lVar4 - iVar5] == true)) {
          psVar2[lVar11] = (sel_t)(lVar4 - iVar5);
          psVar3[lVar11] = (sel_t)uVar9;
          lVar11 = lVar11 + 1;
          iVar7 = iVar7 + 1;
          *probe_sel_count = iVar7;
        }
      }
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_78);
  return;
}

Assistant:

void PerfectHashJoinExecutor::TemplatedFillSelectionVectorProbe(Vector &source, SelectionVector &build_sel_vec,
                                                                SelectionVector &probe_sel_vec, idx_t count,
                                                                idx_t &probe_sel_count) {
	auto min_value = perfect_join_statistics.build_min.GetValueUnsafe<T>();
	auto max_value = perfect_join_statistics.build_max.GetValueUnsafe<T>();

	UnifiedVectorFormat vector_data;
	source.ToUnifiedFormat(count, vector_data);
	auto data = reinterpret_cast<T *>(vector_data.data);
	auto validity_mask = &vector_data.validity;
	// build selection vector for non-dense build
	if (validity_mask->AllValid()) {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	} else {
		for (idx_t i = 0, sel_idx = 0; i < count; ++i) {
			// retrieve value from vector
			auto data_idx = vector_data.sel->get_index(i);
			if (!validity_mask->RowIsValid(data_idx)) {
				continue;
			}
			auto input_value = data[data_idx];
			// add index to selection vector if value in the range
			if (min_value <= input_value && input_value <= max_value) {
				auto idx = (idx_t)(input_value - min_value); // subtract min value to get the idx position
				                                             // check for matches in the build
				if (bitmap_build_idx[idx]) {
					build_sel_vec.set_index(sel_idx, idx);
					probe_sel_vec.set_index(sel_idx++, i);
					probe_sel_count++;
				}
			}
		}
	}
}